

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.H
# Opt level: O0

void __thiscall
amrex::ForkJoin::reg_mf_vec
          (ForkJoin *this,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mfs,
          string *name,Strategy strategy,Intent intent,int owner)

{
  size_type i_00;
  string *name_00;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *this_00;
  Long LVar1;
  undefined4 in_ECX;
  size_type in_RDX;
  vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_> *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  int iVar2;
  
  name_00 = (string *)
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffc0,
                         (key_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::size
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x31de38);
  std::vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::reserve
            (in_RSI,in_RDX);
  iVar2 = 0;
  while( true ) {
    this_00 = (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
              (long)iVar2;
    LVar1 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::size
                      ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                       0x31de61);
    if (LVar1 <= (long)this_00) break;
    i_00 = CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8 = in_R9D;
    Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
              (this_00,i_00);
    in_R9D = in_stack_ffffffffffffffb8;
    reg_mf((ForkJoin *)CONCAT44(in_ECX,in_R8D),(MultiFab *)CONCAT44(in_stack_ffffffffffffffb8,iVar2)
           ,name_00,(int)((ulong)in_RDI >> 0x20),(Strategy)in_RDI,(Intent)((ulong)this_00 >> 0x20),
           (int)in_RSI);
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void reg_mf_vec (const Vector<MultiFab const *> &mfs, const std::string &name,
                     Strategy strategy, Intent intent, int owner = -1) {
        data[name].reserve(mfs.size());
        for (int i = 0; i < mfs.size(); ++i) {
            reg_mf(*mfs[i], name, i, strategy, intent, owner);
        }
    }